

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greedy-lineage.hxx
# Opt level: O2

bool __thiscall
lineage::heuristics::GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_>::
applyBestOperationAndUpdate
          (GreedyLineageAgglomeration<std::vector<double,_std::allocator<double>_>_> *this)

{
  double dVar1;
  EdgeOperation *pEVar2;
  size_t sVar3;
  size_t b;
  size_t sVar4;
  pointer pmVar5;
  long lVar6;
  EdgeOperation move;
  pointer puVar7;
  bool bVar8;
  size_t sVar9;
  _Base_ptr p_Var10;
  size_t *psVar11;
  long lVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> neighbours;
  pair<const_unsigned_long,_double> w;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_98;
  size_t local_78 [4];
  size_t local_58;
  double dStack_50;
  value_type_conflict1 local_48;
  _Base_ptr p_Stack_40;
  
  while( true ) {
    pEVar2 = (this->queue_).c.
             super__Vector_base<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pEVar2 == (this->queue_).c.
                  super__Vector_base<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      return false;
    }
    sVar3 = pEVar2->v0;
    b = pEVar2->v1;
    sVar4 = pEVar2->edition;
    dVar1 = pEVar2->delta;
    move = *pEVar2;
    std::
    priority_queue<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::vector<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation,_std::allocator<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>,_std::less<lineage::heuristics::DynamicLineage<std::vector<double,_std::allocator<double>_>_>::EdgeOperation>_>
    ::pop(&this->queue_);
    if (0.0 <= dVar1) break;
    bVar8 = DynamicLineage<std::vector<double,_std::allocator<double>_>_>::edgeExists
                      (&this->super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>,
                       sVar3,b);
    if ((bVar8) && (sVar9 = getEdition(this,sVar3,b), sVar4 == sVar9)) {
      local_78[2] = sVar3;
      local_78[3] = b;
      local_58 = sVar4;
      dStack_50 = dVar1;
      DynamicLineage<std::vector<double,_std::allocator<double>_>_>::applyMove
                (&this->super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>,move);
      local_98._M_impl.super__Vector_impl_data._M_start = (size_t *)0x0;
      local_98._M_impl.super__Vector_impl_data._M_finish = (size_t *)0x0;
      local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_78[0] = sVar3;
      local_78[1] = b;
      for (lVar12 = 0; puVar7 = local_98._M_impl.super__Vector_impl_data._M_finish,
          psVar11 = local_98._M_impl.super__Vector_impl_data._M_start, lVar12 != 0x10;
          lVar12 = lVar12 + 8) {
        pmVar5 = (this->super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>).
                 vertices_.
                 super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = *(long *)((long)local_78 + lVar12);
        for (p_Var10 = *(_Base_ptr *)
                        ((long)&pmVar5[lVar6]._M_t._M_impl.super__Rb_tree_header + 0x10);
            p_Var10 != &pmVar5[lVar6]._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
          local_48 = *(value_type_conflict1 *)(p_Var10 + 1);
          p_Stack_40 = p_Var10[1]._M_parent;
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_98,&local_48);
        }
      }
      for (; psVar11 != puVar7; psVar11 = psVar11 + 1) {
        sVar3 = *psVar11;
        pmVar5 = (this->super_DynamicLineage<std::vector<double,_std::allocator<double>_>_>).
                 vertices_.
                 super__Vector_base<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>,_std::allocator<std::map<unsigned_long,_double,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        for (p_Var10 = *(_Base_ptr *)
                        ((long)&pmVar5[sVar3]._M_t._M_impl.super__Rb_tree_header + 0x10);
            p_Var10 != &pmVar5[sVar3]._M_t._M_impl.super__Rb_tree_header._M_header;
            p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
          proposeMove(this,sVar3,*(size_t *)(p_Var10 + 1));
        }
      }
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_98);
      return true;
    }
  }
  return false;
}

Assistant:

inline bool virtual applyBestOperationAndUpdate()
    {
        while (!queue_.empty()) {

            const auto move = queue_.top();
            queue_.pop();

            if (move.delta >= 0) {
                return false;
            } else if (!this->edgeExists(move.v0, move.v1)) {
                continue;
            } else if (move.edition != getEdition(move.v0, move.v1)) {
                continue;
            }

            this->applyMove(move);

            std::vector<size_t> neighbours;
            for (auto v : { move.v0, move.v1 }) {
                for (auto w : this->vertices_[v]) {
                    neighbours.push_back(w.first);
                }
            }

            for (auto v : neighbours) {
                for (auto w : this->vertices_[v]) {
                    proposeMove(v, w.first);
                }
            }
            return true;
        }
        return false;
    }